

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealLPAndRecordStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool *interrupt)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  Representation RVar2;
  Statistics *pSVar3;
  int iVar4;
  undefined1 this_01 [8];
  type_conflict5 tVar5;
  Type TVar6;
  int iVar7;
  Settings *pSVar8;
  int iVar9;
  Verbosity old_verbosity;
  Representation RVar10;
  bool bVar11;
  double extraout_XMM0_Qa;
  double dVar12;
  double dVar13;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  undefined4 uVar14;
  undefined4 uVar15;
  double local_248;
  double local_240;
  undefined1 local_238 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_230;
  uint local_228 [2];
  uint auStack_220 [2];
  uint local_218 [2];
  uint auStack_210 [2];
  uint local_208 [2];
  uint auStack_200 [2];
  int local_1f8;
  bool local_1f4;
  undefined8 local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mintol;
  cpp_dec_float<100U,_int,_void> local_170;
  cpp_dec_float<100U,_int,_void> local_120;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  pSVar8 = this->_currentSettings;
  dVar12 = pSVar8->_realParamValues[6];
  if (dVar12 <= (double)pSVar8->_intParamValues[5]) {
    iVar7 = -1;
  }
  else {
    iVar9 = pSVar8->_intParamValues[5] - this->_statistics->iterations;
    iVar7 = -1;
    if (-1 < iVar9) {
      iVar7 = iVar9;
    }
  }
  bVar11 = this->_hasBasis;
  (this->_solver).maxIters = iVar7;
  if (pSVar8->_realParamValues[7] < dVar12) {
    local_240 = pSVar8->_realParamValues[7];
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    dVar12 = local_240 - extraout_XMM0_Qa;
  }
  uVar14 = 0;
  uVar15 = 0;
  if (0.0 <= dVar12) {
    uVar14 = SUB84(dVar12,0);
    uVar15 = (undefined4)((ulong)dVar12 >> 0x20);
  }
  (this->_solver).maxTime = (Real)CONCAT44(uVar15,uVar14);
  local_248 = 10000.0;
  this_00 = &this->_solver;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_238,this_00);
  mintol.m_backend.fpclass = cpp_dec_float_finite;
  mintol.m_backend.prec_elem = 0x10;
  mintol.m_backend.data._M_elems[0] = 0;
  mintol.m_backend.data._M_elems[1] = 0;
  mintol.m_backend.data._M_elems[2] = 0;
  mintol.m_backend.data._M_elems[3] = 0;
  mintol.m_backend.data._M_elems[4] = 0;
  mintol.m_backend.data._M_elems[5] = 0;
  mintol.m_backend.data._M_elems[6] = 0;
  mintol.m_backend.data._M_elems[7] = 0;
  mintol.m_backend.data._M_elems[8] = 0;
  mintol.m_backend.data._M_elems[9] = 0;
  mintol.m_backend.data._M_elems[10] = 0;
  mintol.m_backend.data._M_elems[0xb] = 0;
  mintol.m_backend.data._M_elems[0xc] = 0;
  mintol.m_backend.data._M_elems[0xd] = 0;
  mintol.m_backend.data._M_elems._56_5_ = 0;
  mintol.m_backend.data._M_elems[0xf]._1_3_ = 0;
  mintol.m_backend.exp = 0;
  mintol.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
            (&mintol.m_backend,(cpp_dec_float<100U,_int,_void> *)local_238,&local_248);
  psVar1 = &this->_tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_238,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  local_248 = Tolerances::floatingPointFeastol((Tolerances *)local_238);
  tVar5 = boost::multiprecision::operator<(&local_248,&mintol);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_230);
  if (tVar5) {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_238,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    this_01 = local_238;
    dVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                       (&mintol.m_backend);
    Tolerances::setFloatingPointFeastol((Tolerances *)this_01,dVar12);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_230);
  }
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_238,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  local_248 = Tolerances::floatingPointOpttol((Tolerances *)local_238);
  tVar5 = boost::multiprecision::operator<(&local_248,&mintol);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_230);
  if (tVar5) {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_238,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    dVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                       (&mintol.m_backend);
    Tolerances::setFloatingPointOpttol((Tolerances *)local_238,dVar12);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_230);
  }
  iVar7 = this->_currentSettings->_intParamValues[1];
  if (iVar7 == 2) {
    if ((this->_solver).theRep != ROW) {
LAB_0038d81c:
      RVar10 = ROW;
LAB_0038d81f:
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setRep(this_00,RVar10);
    }
  }
  else {
    RVar10 = COLUMN;
    if (iVar7 == 1) {
      if ((this->_solver).theRep != COLUMN) goto LAB_0038d81f;
    }
    else if (iVar7 == 0) {
      dVar13 = (double)((this->_solver).
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum + 1) * this->_currentSettings->_realParamValues[0x10];
      dVar12 = (double)((this->_solver).
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum + 1);
      RVar2 = (this->_solver).theRep;
      if (RVar2 != COLUMN && dVar12 <= dVar13) goto LAB_0038d81f;
      if (RVar2 != ROW && dVar13 < dVar12) goto LAB_0038d81c;
    }
  }
  iVar7 = this->_currentSettings->_intParamValues[2];
  if (iVar7 == 1) {
    TVar6 = (this->_solver).theType;
    RVar10 = (this->_solver).theRep;
    if (TVar6 == ENTER || RVar10 != ROW) {
      if (RVar10 != COLUMN) goto LAB_0038d897;
      goto LAB_0038d883;
    }
LAB_0038d88c:
    TVar6 = ENTER;
  }
  else {
    if (iVar7 != 0) goto LAB_0038d897;
    TVar6 = (this->_solver).theType;
    RVar10 = (this->_solver).theRep;
    if (TVar6 != ENTER && RVar10 == COLUMN) goto LAB_0038d88c;
    if (RVar10 != ROW) goto LAB_0038d897;
LAB_0038d883:
    if (TVar6 == LEAVE) goto LAB_0038d897;
    TVar6 = LEAVE;
  }
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setType(this_00,TVar6);
LAB_0038d897:
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_80,this->_currentSettings->_realParamValues[0xf],(type *)0x0);
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 0xc) =
       local_80.data._M_elems._48_8_;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 0xe) =
       local_80.data._M_elems._56_8_;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 8) =
       local_80.data._M_elems._32_8_;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 10) =
       local_80.data._M_elems._40_8_;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 4) =
       local_80.data._M_elems._16_8_;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 6) =
       local_80.data._M_elems._24_8_;
  *(undefined8 *)(this->_solver).sparsePricingFactor.m_backend.data._M_elems =
       local_80.data._M_elems._0_8_;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 2) =
       local_80.data._M_elems._8_8_;
  (this->_solver).sparsePricingFactor.m_backend.exp = local_80.exp;
  (this->_solver).sparsePricingFactor.m_backend.neg = local_80.neg;
  (this->_solver).sparsePricingFactor.m_backend.fpclass = local_80.fpclass;
  (this->_solver).sparsePricingFactor.m_backend.prec_elem = local_80.prec_elem;
  pSVar8 = this->_currentSettings;
  iVar7 = pSVar8->_intParamValues[0x14];
  if (iVar7 == 0) {
    (this->_solver).hyperPricingLeave = false;
    (this->_solver).hyperPricingEnter = false;
  }
  else if ((iVar7 == 2) ||
          ((iVar7 == 1 &&
           (5000 < (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum +
                   (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum)))) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::hyperPricing(this_00,true);
    pSVar8 = this->_currentSettings;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_d0,pSVar8->_realParamValues[0x13],(type *)0x0);
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 0xc) = local_d0.data._M_elems._48_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 0xe) = local_d0.data._M_elems._56_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 8) = local_d0.data._M_elems._32_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 10) = local_d0.data._M_elems._40_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 4) = local_d0.data._M_elems._16_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 6) = local_d0.data._M_elems._24_8_;
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .nonzeroFactor.m_backend.data._M_elems = local_d0.data._M_elems._0_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 2) = local_d0.data._M_elems._8_8_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.exp = local_d0.exp;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.neg = local_d0.neg;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.fpclass = local_d0.fpclass;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.prec_elem = local_d0.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_120,this->_currentSettings->_realParamValues[0x14],(type *)0x0);
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 0xc) = local_120.data._M_elems._48_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 0xe) = local_120.data._M_elems._56_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 8) = local_120.data._M_elems._32_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 10) = local_120.data._M_elems._40_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 4) = local_120.data._M_elems._16_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 6) = local_120.data._M_elems._24_8_;
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .fillFactor.m_backend.data._M_elems = local_120.data._M_elems._0_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 2) = local_120.data._M_elems._8_8_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.exp = local_120.exp;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.neg = local_120.neg;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.fpclass = local_120.fpclass;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.prec_elem = local_120.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_170,this->_currentSettings->_realParamValues[0x15],(type *)0x0);
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xc] = local_170.data._M_elems[0xc];
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xd] = local_170.data._M_elems[0xd];
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xe] = local_170.data._M_elems[0xe];
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xf] = local_170.data._M_elems[0xf];
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[8] = local_170.data._M_elems[8];
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[9] = local_170.data._M_elems[9];
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[10] = local_170.data._M_elems[10];
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[0xb] = local_170.data._M_elems[0xb];
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[4] = local_170.data._M_elems[4];
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[5] = local_170.data._M_elems[5];
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[6] = local_170.data._M_elems[6];
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.data._M_elems[7] = local_170.data._M_elems[7];
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .memFactor.m_backend.data._M_elems = local_170.data._M_elems._0_8_;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memFactor.m_backend.data._M_elems + 2) = local_170.data._M_elems._8_8_;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.exp = local_170.exp;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.neg = local_170.neg;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.fpclass = local_170.fpclass;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.prec_elem = local_170.prec_elem;
  (*this->_statistics->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve(this_00,interrupt,true);
  (*this->_statistics->simplexTime->_vptr_Timer[4])();
  iVar7 = (this->_solver).
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .iterCount;
  if (0 < iVar7) {
    SLUFactorRational::clear(&this->_rationalLUSolver);
    iVar7 = (this->_solver).
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .iterCount;
  }
  pSVar3 = this->_statistics;
  pSVar3->iterations = pSVar3->iterations + iVar7;
  iVar9 = iVar7;
  if (iVar7 != 0) {
    iVar9 = (this->_solver).primalCount;
  }
  pSVar3->iterationsPrimal = pSVar3->iterationsPrimal + iVar9;
  iVar9 = 0;
  if (bVar11 != false) {
    iVar9 = iVar7;
  }
  pSVar3->iterationsFromBasis = pSVar3->iterationsFromBasis + iVar9;
  pSVar3->iterationsPolish = pSVar3->iterationsPolish + (this->_solver).polishCount;
  pSVar3->boundflips = pSVar3->boundflips + (this->_solver).totalboundflips;
  (*((this->_solver).multTimeSparse)->_vptr_Timer[6])();
  this->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + this->_statistics->multTimeSparse;
  (*((this->_solver).multTimeFull)->_vptr_Timer[6])();
  this->_statistics->multTimeFull = extraout_XMM0_Qa_01 + this->_statistics->multTimeFull;
  (*((this->_solver).multTimeColwise)->_vptr_Timer[6])();
  this->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + this->_statistics->multTimeColwise;
  (*((this->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  pSVar3 = this->_statistics;
  pSVar3->multTimeUnsetup = extraout_XMM0_Qa_03 + pSVar3->multTimeUnsetup;
  iVar7 = (this->_solver).multFullCalls;
  iVar9 = (this->_solver).multColwiseCalls;
  iVar4 = (this->_solver).multUnsetupCalls;
  pSVar3->multSparseCalls = pSVar3->multSparseCalls + (this->_solver).multSparseCalls;
  pSVar3->multFullCalls = pSVar3->multFullCalls + iVar7;
  pSVar3->multColwiseCalls = pSVar3->multColwiseCalls + iVar9;
  pSVar3->multUnsetupCalls = pSVar3->multUnsetupCalls + iVar4;
  (*((this->_slufactor).
     super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .factorTime)->_vptr_Timer[6])();
  this->_statistics->luFactorizationTimeReal =
       extraout_XMM0_Qa_04 + this->_statistics->luFactorizationTimeReal;
  (*((this->_slufactor).solveTime)->_vptr_Timer[6])();
  pSVar3 = this->_statistics;
  pSVar3->luSolveTimeReal = extraout_XMM0_Qa_05 + pSVar3->luSolveTimeReal;
  pSVar3->luFactorizationsReal =
       pSVar3->luFactorizationsReal +
       (this->_slufactor).
       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .factorCount;
  pSVar3->luSolvesReal = pSVar3->luSolvesReal + (this->_slufactor).solveCount;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::resetCounters(&this->_slufactor);
  bVar11 = (this->_solver).theRep == ROW;
  pSVar3 = this->_statistics;
  pSVar3->degenPivotsPrimal =
       pSVar3->degenPivotsPrimal +
       *(int *)((long)(&(this->_solver).primalDegenSum.m_backend.data + -1) + 0x30 +
               (ulong)bVar11 * 4);
  pSVar3->degenPivotsDual =
       pSVar3->degenPivotsDual +
       *(int *)((long)(&(this->_solver).primalDegenSum.m_backend.data + -1) + 0x30 +
               (ulong)!bVar11 * 4);
  local_238 = *(undefined1 (*) [8])(this->_solver).dualDegenSum.m_backend.data._M_elems;
  _Stack_230._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        ((this->_solver).dualDegenSum.m_backend.data._M_elems + 2);
  local_228 = *(uint (*) [2])((this->_solver).dualDegenSum.m_backend.data._M_elems + 4);
  auStack_220 = *(uint (*) [2])((this->_solver).dualDegenSum.m_backend.data._M_elems + 6);
  local_218 = *(uint (*) [2])((this->_solver).dualDegenSum.m_backend.data._M_elems + 8);
  auStack_210 = *(uint (*) [2])((this->_solver).dualDegenSum.m_backend.data._M_elems + 10);
  local_208 = *(uint (*) [2])((this->_solver).dualDegenSum.m_backend.data._M_elems + 0xc);
  auStack_200 = *(uint (*) [2])((this->_solver).dualDegenSum.m_backend.data._M_elems + 0xe);
  local_1f8 = (this->_solver).dualDegenSum.m_backend.exp;
  local_1f4 = (this->_solver).dualDegenSum.m_backend.neg;
  local_1f0._0_4_ = (this->_solver).dualDegenSum.m_backend.fpclass;
  local_1f0._4_4_ = (this->_solver).dualDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(pSVar3->sumDualDegen).m_backend,(cpp_dec_float<100U,_int,_void> *)local_238);
  local_238 = *(undefined1 (*) [8])(this->_solver).primalDegenSum.m_backend.data._M_elems;
  _Stack_230._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        ((this->_solver).primalDegenSum.m_backend.data._M_elems + 2);
  local_228 = *(uint (*) [2])((this->_solver).primalDegenSum.m_backend.data._M_elems + 4);
  auStack_220 = *(uint (*) [2])((this->_solver).primalDegenSum.m_backend.data._M_elems + 6);
  local_218 = *(uint (*) [2])((this->_solver).primalDegenSum.m_backend.data._M_elems + 8);
  auStack_210 = *(uint (*) [2])((this->_solver).primalDegenSum.m_backend.data._M_elems + 10);
  local_208 = *(uint (*) [2])((this->_solver).primalDegenSum.m_backend.data._M_elems + 0xc);
  auStack_200 = *(uint (*) [2])((this->_solver).primalDegenSum.m_backend.data._M_elems + 0xe);
  local_1f8 = (this->_solver).primalDegenSum.m_backend.exp;
  local_1f4 = (this->_solver).primalDegenSum.m_backend.neg;
  local_1f0._0_4_ = (this->_solver).primalDegenSum.m_backend.fpclass;
  local_1f0._4_4_ = (this->_solver).primalDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
            (&(this->_statistics->sumPrimalDegen).m_backend,
             (cpp_dec_float<100U,_int,_void> *)local_238);
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}